

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O3

void ImPlot::CalculateBins<float>
               (float *values,int count,ImPlotBin meth,ImPlotRange *range,int *bins_out,
               double *width_out)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  switch(meth) {
  case -4:
    dVar5 = (double)count;
    dVar3 = 0.0;
    if (0 < count) {
      dVar4 = 0.0;
      uVar2 = 0;
      do {
        dVar4 = dVar4 + (double)values[uVar2] * (1.0 / dVar5);
        uVar2 = uVar2 + 1;
      } while ((uint)count != uVar2);
      dVar3 = 0.0;
      uVar2 = 0;
      do {
        dVar3 = dVar3 + ((double)values[uVar2] - dVar4) * ((double)values[uVar2] - dVar4) *
                        (1.0 / (dVar5 + -1.0));
        uVar2 = uVar2 + 1;
      } while ((uint)count != uVar2);
    }
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar5 = cbrt(dVar5);
    dVar5 = (dVar3 * 3.49) / dVar5;
    *width_out = dVar5;
    dVar3 = round((range->Max - range->Min) / dVar5);
    goto LAB_001befc6;
  case -3:
    dVar3 = cbrt((double)count);
    dVar3 = dVar3 + dVar3;
    break;
  case -2:
    dVar3 = log2((double)count);
    dVar3 = dVar3 + 1.0;
    break;
  case -1:
    dVar3 = (double)count;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    break;
  default:
    iVar1 = *bins_out;
    goto LAB_001befcd;
  }
  dVar3 = ceil(dVar3);
LAB_001befc6:
  iVar1 = (int)dVar3;
  *bins_out = iVar1;
LAB_001befcd:
  *width_out = (range->Max - range->Min) / (double)iVar1;
  return;
}

Assistant:

static inline void CalculateBins(const T* values, int count, ImPlotBin meth, const ImPlotRange& range, int& bins_out, double& width_out) {
    switch (meth) {
        case ImPlotBin_Sqrt:
            bins_out  = (int)ceil(sqrt(count));
            break;
        case ImPlotBin_Sturges:
            bins_out  = (int)ceil(1.0 + log2(count));
            break;
        case ImPlotBin_Rice:
            bins_out  = (int)ceil(2 * cbrt(count));
            break;
        case ImPlotBin_Scott:
            width_out = 3.49 * ImStdDev(values, count) / cbrt(count);
            bins_out  = (int)round(range.Size() / width_out);
            break;
    }
    width_out = range.Size() / bins_out;
}